

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall
ON_TextureMapping::Evaluate
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T,ON_Xform *P_xform,
          ON_Xform *N_xform)

{
  undefined1 local_70 [8];
  ON_3dVector V;
  ON_3dPoint Q;
  int rc;
  ON_Xform *N_xform_local;
  ON_Xform *P_xform_local;
  ON_3dPoint *T_local;
  ON_3dVector *N_local;
  ON_3dPoint *P_local;
  ON_TextureMapping *this_local;
  
  ON_Xform::operator*((ON_3dPoint *)&V.z,P_xform,P);
  if (this->m_projection == ray_projection) {
    ON_Xform::operator*((ON_3dVector *)local_70,N_xform,N);
    ON_3dVector::Unitize((ON_3dVector *)local_70);
    Q.z._4_4_ = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                          (this,&V.z,local_70,T);
  }
  else {
    Q.z._4_4_ = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                          (this,&V.z,N,T);
  }
  return Q.z._4_4_;
}

Assistant:

int ON_TextureMapping::Evaluate(
        const ON_3dPoint& P,
        const ON_3dVector& N,
        ON_3dPoint* T,
        const ON_Xform& P_xform,
        const ON_Xform& N_xform
        ) const
{
  int rc;
  ON_3dPoint Q = P_xform*P;
  if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
  {
    // need a transformed normal
    ON_3dVector V = N_xform*N;
    V.Unitize();
    rc = Evaluate(Q,V,T);
  }
  else
  {
    // normal is ignored
    rc = Evaluate(Q,N,T);
  }
  return rc;
}